

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic_simplification.hpp
# Opt level: O3

void __thiscall
optimization::algebraic_simplification::AlgebraicSimplification::optimize_func
          (AlgebraicSimplification *this,string *name,MirFunction *mirFunction)

{
  undefined4 uVar1;
  long *plVar2;
  ulong uVar3;
  AlgebraicSimplification *this_00;
  MirFunction *mirFunction_00;
  int iVar4;
  uint32_t uVar5;
  _Base_ptr p_Var6;
  long lVar7;
  OpInst *pOVar8;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> tVar9;
  _Base_ptr p_Var10;
  char cVar11;
  byte bVar12;
  ulong uVar13;
  size_t i;
  uint uVar14;
  _Base_ptr *insts;
  uint uVar15;
  _Self __tmp;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_1b8;
  undefined1 local_1b0 [8];
  variant<int,_mir::inst::VarId> local_1a8;
  AlgebraicSimplification *local_190;
  uint32_t offIndex_1;
  undefined4 uStack_184;
  uint32_t local_180;
  uint32_t offIndex;
  undefined **local_170;
  undefined4 local_168;
  undefined1 local_160;
  undefined2 local_15f;
  _Base_ptr *local_158;
  uint32_t local_14c;
  MirFunction *local_148;
  variant<int,_mir::inst::VarId> *local_140;
  _Rb_tree_node_base *local_138;
  undefined1 local_130 [16];
  uint32_t local_120;
  undefined1 local_118;
  undefined2 local_117;
  VarId local_110;
  undefined1 local_100 [16];
  uint32_t local_f0;
  undefined1 local_e8;
  undefined2 local_e7;
  VarId local_e0;
  VarId local_d0;
  VarId local_c0;
  Value local_b0;
  Value local_90;
  Value local_70;
  Value local_50;
  
  p_Var10 = (mirFunction->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_138 = &(mirFunction->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190 = this;
  local_148 = mirFunction;
  if (p_Var10 != local_138) {
    do {
      p_Var6 = p_Var10[3]._M_parent;
      if (p_Var10[3]._M_left != p_Var6) {
        insts = &p_Var10[3]._M_parent;
        i = 0;
        do {
          plVar2 = *(long **)(&p_Var6->_M_color + i * 2);
          iVar4 = (**(code **)(*plVar2 + 8))(plVar2);
          mirFunction_00 = local_148;
          this_00 = local_190;
          if (iVar4 == 1) {
            iVar4 = (int)plVar2[0xb];
            if (iVar4 == 5) {
              if ((((char)plVar2[6] != '\0') && ((char)plVar2[10] == '\0')) &&
                 (uVar15 = *(uint *)(plVar2 + 8), uVar15 != 0)) {
                uVar14 = -uVar15;
                if (0 < (int)uVar15) {
                  uVar14 = uVar15;
                }
                if ((uVar14 & uVar14 - 1) == 0) {
                  bVar12 = 0;
                  if ((uVar14 & 1) == 0) {
                    bVar12 = 0;
                    uVar13 = (ulong)uVar14;
                    do {
                      bVar12 = bVar12 + 1;
                      uVar3 = uVar13 & 2;
                      uVar13 = uVar13 >> 1;
                    } while (uVar3 == 0);
                  }
                  *(undefined4 *)(plVar2 + 0xb) = 0xc;
                  *(int *)(plVar2 + 8) = ~(-1 << (bVar12 & 0x1f));
                  *(undefined2 *)((long)plVar2 + 0x51) = 1;
                }
                else {
                  _offIndex_1 = (undefined **)((ulong)_offIndex_1 & 0xffffffff00000000);
                  local_158 = insts;
                  local_14c = getNewVar(local_190,local_148);
                  local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100
                  ;
                  local_140 = (variant<int,_mir::inst::VarId> *)(plVar2 + 4);
                  local_70._24_1_ = SUB81(plVar2[6],0);
                  local_1b0 = (undefined1  [8])&local_70.field_0x8;
                  local_d0.id = local_14c;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[(long)(char)local_70._24_1_ + 1]._M_data)
                            ((anon_class_8_1_a78179b7_conflict *)local_1b0,local_140);
                  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98
                  ;
                  local_70._25_2_ = *(undefined2 *)((long)plVar2 + 0x31);
                  insertDivideInstsFromPaper
                            (this_00,uVar15,&local_d0,&local_70,mirFunction_00,
                             (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)local_158,i,&offIndex_1);
                  uVar5 = getNewVar(this_00,mirFunction_00);
                  uVar14 = offIndex_1 + 1;
                  offIndex_1 = uVar14;
                  tVar9.
                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                       operator_new(0x60);
                  local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100
                  ;
                  local_100._8_8_ = &PTR_display_001eb100;
                  local_f0 = local_14c;
                  local_e8 = 1;
                  local_100._0_8_ = &PTR_display_001ecf98;
                  local_e7._0_1_ = Lsl;
                  local_e7._1_1_ = '\0';
                  local_90._24_1_ = 0;
                  local_90.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98
                  ;
                  local_90.shift = Lsl;
                  local_90.shift_amount = '\0';
                  local_e0.id = uVar5;
                  local_90._8_4_ = uVar15;
                  mir::inst::OpInst::OpInst
                            ((OpInst *)
                             tVar9.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl,&local_e0
                             ,(Value *)local_100,&local_90,Mul);
                  local_1b0 = (undefined1  [8])
                              tVar9.
                              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                              .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                  insertInst(local_190,
                             (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)local_158,uVar14 + i,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             local_1b0);
                  if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)
                      local_1b0 !=
                      (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0)
                  {
                    (**(code **)(*(_func_int **)local_1b0 + 0x28))();
                  }
                  uVar15 = offIndex_1 + 1;
                  offIndex_1 = uVar15;
                  tVar9.
                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                       operator_new(0x60);
                  local_110.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  local_110.id = *(uint32_t *)(plVar2 + 2);
                  local_b0._24_1_ = SUB81(plVar2[6],0);
                  local_1b0 = (undefined1  [8])&local_b0.field_0x8;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[(long)(char)local_b0._24_1_ + 1]._M_data)
                            ((anon_class_8_1_a78179b7_conflict *)local_1b0,local_140);
                  local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98
                  ;
                  local_b0._25_2_ = *(undefined2 *)((long)plVar2 + 0x31);
                  local_130._8_8_ = &PTR_display_001eb100;
                  local_118 = 1;
                  local_130._0_8_ = &PTR_display_001ecf98;
                  local_117._0_1_ = Lsl;
                  local_117._1_1_ = '\0';
                  local_120 = uVar5;
                  mir::inst::OpInst::OpInst
                            ((OpInst *)
                             tVar9.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl,
                             &local_110,&local_b0,(Value *)local_130,Sub);
                  insts = local_158;
                  _offIndex = (undefined **)
                              tVar9.
                              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                              .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                  insertInst(local_190,
                             (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)local_158,uVar15 + i,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             &offIndex);
                  if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)
                      _offIndex !=
                      (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0)
                  {
                    (**(code **)(*_offIndex + 0x28))();
                  }
LAB_00139870:
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)insts,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                       *)(&(*insts)->_M_color + i * 2));
                  i = i - 1;
                }
              }
            }
            else if (iVar4 == 3) {
              lVar7 = (long)(char)plVar2[6];
              if (((lVar7 != 0) && ((char)plVar2[10] == '\0')) &&
                 (uVar15 = *(uint *)(plVar2 + 8), uVar15 != 0)) {
                if (uVar15 == 0xffffffff) {
                  *(undefined4 *)(plVar2 + 0xb) = 1;
LAB_00139210:
                  local_1b0 = (undefined1  [8])(plVar2 + 8);
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[lVar7 + 1]._M_data)
                            ((anon_class_8_1_8991fb9c_conflict *)local_1b0,
                             (variant<int,_mir::inst::VarId> *)(plVar2 + 4));
                  *(undefined2 *)((long)plVar2 + 0x51) = *(undefined2 *)((long)plVar2 + 0x31);
                  if ((char)plVar2[6] != '\0') {
                    *(undefined1 *)(plVar2 + 6) = 0;
                  }
                  *(undefined4 *)(plVar2 + 4) = 0;
                  *(undefined2 *)((long)plVar2 + 0x31) = 1;
                }
                else {
                  uVar14 = -uVar15;
                  if (0 < (int)uVar15) {
                    uVar14 = uVar15;
                  }
                  if ((uVar14 & uVar14 - 1) != 0) {
                    _offIndex = (undefined **)((ulong)_offIndex & 0xffffffff00000000);
                    local_c0.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001eb100;
                    local_c0.id = *(uint32_t *)(plVar2 + 2);
                    local_1b0 = (undefined1  [8])&local_50.field_0x8;
                    local_50._24_1_ = (char)plVar2[6];
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[lVar7 + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_1b0,
                               (variant<int,_mir::inst::VarId> *)(plVar2 + 4));
                    local_50.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001ecf98;
                    local_50._25_2_ = *(undefined2 *)((long)plVar2 + 0x31);
                    insertDivideInstsFromPaper
                              (local_190,uVar15,&local_c0,&local_50,local_148,
                               (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)insts,i,&offIndex);
                    goto LAB_00139870;
                  }
                  iVar4 = 0;
                  if ((uVar14 & 1) == 0) {
                    iVar4 = 0;
                    uVar13 = (ulong)uVar14;
                    do {
                      iVar4 = iVar4 + 1;
                      uVar3 = uVar13 & 2;
                      uVar13 = uVar13 >> 1;
                    } while (uVar3 == 0);
                  }
                  *(undefined4 *)(plVar2 + 0xb) = 0x12;
                  *(int *)(plVar2 + 8) = iVar4;
                  *(undefined2 *)((long)plVar2 + 0x51) = 1;
                  if (-1 < (int)uVar15) goto LAB_00139887;
                  uVar1 = *(undefined4 *)(plVar2 + 2);
                  pOVar8 = (OpInst *)operator_new(0x60);
                  _offIndex_1 = &PTR_display_001eb100;
                  local_180 = *(uint32_t *)(plVar2 + 2);
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)0;
                  local_1b0 = (undefined1  [8])&PTR_display_001ecf98;
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
                  local_160 = 1;
                  local_170 = &PTR_display_001eb100;
                  _offIndex = &PTR_display_001ecf98;
                  local_15f._0_1_ = Lsl;
                  local_15f._1_1_ = '\0';
                  local_168 = uVar1;
                  mir::inst::OpInst::OpInst
                            (pOVar8,(VarId *)&offIndex_1,(Value *)local_1b0,(Value *)&offIndex,Sub);
                  local_1b8._M_head_impl = (Inst *)pOVar8;
                  insertInst(local_190,
                             (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)insts,i + 1,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             &local_1b8);
LAB_0013950a:
                  if ((OpInst *)local_1b8._M_head_impl != (OpInst *)0x0) {
                    (*(((Inst *)&(local_1b8._M_head_impl)->super_Displayable)->super_Displayable).
                      _vptr_Displayable[5])();
                  }
                }
              }
            }
            else if (iVar4 == 2) {
              cVar11 = (char)plVar2[6];
              if (cVar11 == '\0') {
                if ((long)(char)plVar2[10] != 0) {
                  _offIndex = (undefined **)(plVar2 + 4);
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)(int)plVar2[4];
                  local_1b0 = (undefined1  [8])&PTR_display_001ecf98;
                  local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                       *(undefined2 *)((long)plVar2 + 0x31);
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[(long)(char)plVar2[10] + 1]._M_data)
                            ((anon_class_8_1_8991fb9c_conflict *)&offIndex,
                             (variant<int,_mir::inst::VarId> *)(plVar2 + 8));
                  *(undefined2 *)((long)plVar2 + 0x31) = *(undefined2 *)((long)plVar2 + 0x51);
                  _offIndex = (undefined **)(plVar2 + 8);
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_8991fb9c_conflict *)&offIndex,&local_1a8);
                  *(undefined2 *)((long)plVar2 + 0x51) =
                       local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                  cVar11 = (char)plVar2[6];
                  if (cVar11 != '\0') goto LAB_00139192;
                }
              }
              else {
LAB_00139192:
                if (((char)plVar2[10] == '\0') && (uVar15 = *(uint *)(plVar2 + 8), uVar15 != 0)) {
                  if (uVar15 == 0xffffffff) {
                    *(undefined4 *)(plVar2 + 0xb) = 1;
                    lVar7 = (long)cVar11;
                    goto LAB_00139210;
                  }
                  uVar14 = -uVar15;
                  if (0 < (int)uVar15) {
                    uVar14 = uVar15;
                  }
                  if ((uVar14 & uVar14 - 1) == 0) {
                    iVar4 = 0;
                    if ((uVar14 & 1) == 0) {
                      iVar4 = 0;
                      uVar13 = (ulong)uVar14;
                      do {
                        iVar4 = iVar4 + 1;
                        uVar3 = uVar13 & 2;
                        uVar13 = uVar13 >> 1;
                      } while (uVar3 == 0);
                    }
                    *(undefined4 *)(plVar2 + 0xb) = 0x10;
                    *(int *)(plVar2 + 8) = iVar4;
                    *(undefined2 *)((long)plVar2 + 0x51) = 1;
                    if ((int)uVar15 < 0) {
                      uVar1 = *(undefined4 *)(plVar2 + 2);
                      pOVar8 = (OpInst *)operator_new(0x60);
                      _offIndex_1 = &PTR_display_001eb100;
                      local_180 = *(uint32_t *)(plVar2 + 2);
                      local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
                      local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                           (_Uninitialized<int,_true>)0;
                      local_1b0 = (undefined1  [8])&PTR_display_001ecf98;
                      local_1a8.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
                      local_160 = 1;
                      local_170 = &PTR_display_001eb100;
                      _offIndex = &PTR_display_001ecf98;
                      local_15f._0_1_ = Lsl;
                      local_15f._1_1_ = '\0';
                      local_168 = uVar1;
                      mir::inst::OpInst::OpInst
                                (pOVar8,(VarId *)&offIndex_1,(Value *)local_1b0,(Value *)&offIndex,
                                 Sub);
                      local_1b8._M_head_impl = (Inst *)pOVar8;
                      insertInst(local_190,
                                 (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  *)insts,i + 1,
                                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  *)&local_1b8);
                      goto LAB_0013950a;
                    }
                  }
                }
              }
            }
          }
LAB_00139887:
          i = i + 1;
          p_Var6 = p_Var10[3]._M_parent;
        } while (i < (ulong)((long)p_Var10[3]._M_left - (long)p_Var6 >> 3));
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_138);
  }
  return;
}

Assistant:

void optimize_func(std::string name, mir::inst::MirFunction& mirFunction) {
    for (auto blksIter = mirFunction.basic_blks.begin();
         blksIter != mirFunction.basic_blks.end(); blksIter++) {
      for (size_t i = 0; i < blksIter->second.inst.size(); i++) {
        mir::inst::Inst* instIter = blksIter->second.inst.at(i).get();
        switch (instIter->inst_kind()) {
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opPtr = (mir::inst::OpInst*)instIter;
            switch (opPtr->op) {
              case mir::inst::Op::Mul: {
                if (opPtr->lhs.is_immediate() && !opPtr->rhs.is_immediate()) {
                  mir::inst::Value tmp = opPtr->lhs;
                  opPtr->lhs = opPtr->rhs;
                  opPtr->rhs = tmp;
                }
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if (num == -1) {
                      opPtr->op = mir::inst::Op::Sub;
                      opPtr->rhs = opPtr->lhs;
                      opPtr->lhs = mir::inst::Value(0);
                    } else if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t mul;

                      mul = std::abs(num);
                      for (index = 0; (mul & 1) == 0; mul >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::Shl;
                      opPtr->rhs = mir::inst::Value(index);

                      if (num < 0) {
                        insertInst(blksIter->second.inst, i + 1,
                                   std::make_unique<mir::inst::OpInst>(
                                       opPtr->dest, mir::inst::Value(0),
                                       mir::inst::Value(opPtr->dest),
                                       mir::inst::Op::Sub));
                      }
                    }
                  }
                }
                break;
              }
              case mir::inst::Op::Div: {
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if (num == -1) {
                      opPtr->op = mir::inst::Op::Sub;
                      opPtr->rhs = opPtr->lhs;
                      opPtr->lhs = mir::inst::Value(0);
                    } else if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t mul;

                      mul = std::abs(num);
                      for (index = 0; (mul & 1) == 0; mul >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::ShrA;
                      opPtr->rhs = mir::inst::Value(index);

                      if (num < 0) {
                        insertInst(blksIter->second.inst, i + 1,
                                   std::make_unique<mir::inst::OpInst>(
                                       opPtr->dest, mir::inst::Value(0),
                                       mir::inst::Value(opPtr->dest),
                                       mir::inst::Op::Sub));
                      }
                    } else {
                      uint32_t offIndex;

                      offIndex = 0;

                      insertDivideInstsFromPaper(
                          num, opPtr->dest, opPtr->lhs, mirFunction,
                          blksIter->second.inst, i, offIndex);

                      blksIter->second.inst.erase(
                          blksIter->second.inst.begin() + i);
                      i--;
                    }
                  }
                }
                break;
              }
              case mir::inst::Op::Rem: {
                if (!opPtr->lhs.is_immediate() && opPtr->rhs.is_immediate()) {
                  int32_t num = *(opPtr->rhs.get_if<int32_t>());
                  if (num != 0) {
                    if ((std::abs(num) & (std::abs(num) - 1)) == 0) {
                      uint32_t index;
                      uint32_t rem;

                      rem = std::abs(num);
                      for (index = 0; (rem & 1) == 0; rem >>= 1, index++)
                        ;
                      opPtr->op = mir::inst::Op::And;
                      opPtr->rhs = mir::inst::Value(((uint32_t)1 << index) - 1);
                      // TODO: deal the problem of negative lhs
                    } else {
                      uint32_t offIndex;

                      uint32_t tmp1;
                      uint32_t tmp2;

                      offIndex = 0;

                      tmp1 = getNewVar(mirFunction);
                      insertDivideInstsFromPaper(
                          num, mir::inst::VarId(tmp1), opPtr->lhs, mirFunction,
                          blksIter->second.inst, i, offIndex);
                      tmp2 = getNewVar(mirFunction);
                      insertInst(
                          blksIter->second.inst, i + ++offIndex,
                          std::unique_ptr<mir::inst::Inst>(
                              new mir::inst::OpInst(mir::inst::VarId(tmp2),
                                                    mir::inst::VarId(tmp1),
                                                    mir::inst::Value(num),
                                                    mir::inst::Op::Mul)));
                      insertInst(
                          blksIter->second.inst, i + ++offIndex,
                          std::unique_ptr<mir::inst::Inst>(
                              new mir::inst::OpInst(opPtr->dest, opPtr->lhs,
                                                    mir::inst::VarId(tmp2),
                                                    mir::inst::Op::Sub)));
                      blksIter->second.inst.erase(
                          blksIter->second.inst.begin() + i);
                      i--;
                    }
                  }
                }
                break;
              }
              default:
                break;
            }
            break;
          }
          default:
            break;
        }
      }
    }
  }